

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O1

err_t cmdSigSign(char *sig_name,char *name,char *certs,octet *date,octet *privkey,size_t privkey_len
                )

{
  size_t *certs_len;
  octet *hash;
  ulong uVar1;
  bool bVar2;
  bool_t bVar3;
  err_t eVar4;
  uint uVar5;
  cmd_sig_t *sig;
  size_t sVar6;
  char *oid;
  cmd_sig_t *pcVar7;
  octet *buf;
  octet *poVar8;
  size_t oid_len;
  cmd_sig_t *local_48;
  size_t cert_len;
  size_t offset;
  
  oid_len = 0x10;
  bVar3 = strIsValid(sig_name);
  if (bVar3 == 0) {
    return 0x6d;
  }
  bVar3 = strIsValid(name);
  if (bVar3 == 0) {
    return 0x6d;
  }
  uVar1 = privkey_len - 0x18 >> 3;
  if (5 < (privkey_len << 0x3d | uVar1)) {
    return 0x6d;
  }
  if ((0x2bUL >> (uVar1 & 0x3f) & 1) == 0) {
    return 0x6d;
  }
  bVar3 = memIsValid(date,6);
  if (bVar3 == 0) {
    return 0x6d;
  }
  bVar3 = memIsValid(privkey,privkey_len);
  if (bVar3 == 0) {
    return 0x6d;
  }
  bVar3 = memIsZero(date,6);
  if ((bVar3 == 0) && (bVar3 = tmDateIsValid2(date), bVar3 == 0)) {
    return 0x134;
  }
  sig = (cmd_sig_t *)blobCreate(oid_len + privkey_len * 2 + 0x780);
  if (sig == (cmd_sig_t *)0x0) {
    return 0x6e;
  }
  poVar8 = sig->date;
  memCopy(poVar8,date,6);
  certs_len = &sig->certs_len;
  if (certs == (char *)0x0) {
    *certs_len = 0;
  }
  else {
    sig->certs_len = 0x5b4;
    local_48 = (cmd_sig_t *)sig->certs;
    eVar4 = cmdCVCsCreate((octet *)local_48,certs_len,certs);
    if ((eVar4 != 0) || (eVar4 = cmdCVCsVal(local_48->sig,*certs_len,poVar8), eVar4 != 0))
    goto LAB_001067a3;
  }
  if (sig->certs_len != 0) {
    uVar5 = cmdCVCsGetLast(&offset,&cert_len,sig->certs,sig->certs_len);
    if ((uVar5 == 0) &&
       (uVar5 = btokCVCMatch(sig->certs + offset,cert_len,privkey,privkey_len), uVar5 == 0)) {
      bVar2 = true;
      pcVar7 = sig;
    }
    else {
      blobClose(sig);
      bVar2 = false;
      pcVar7 = (cmd_sig_t *)(ulong)uVar5;
    }
    if (!bVar2) {
      return (err_t)pcVar7;
    }
  }
  eVar4 = cmdSigParamsStd((bign_params *)(sig + 1),privkey_len);
  if (eVar4 == 0) {
    hash = sig[1].certs + 0xf8;
    local_48 = sig + 1;
    eVar4 = cmdSigHash(hash,privkey_len,name,0,sig->certs,sig->certs_len,poVar8);
    if (eVar4 == 0) {
      poVar8 = sig[1].certs + 0xe8;
      if (privkey_len < 0x21) {
        oid = "1.2.112.0.2.0.34.101.31.81";
      }
      else {
        oid = "1.2.112.0.2.0.34.101.77.13";
        if (privkey_len == 0x30) {
          oid = "1.2.112.0.2.0.34.101.77.12";
        }
      }
      eVar4 = bignOidToDER(poVar8,&oid_len,oid);
      if (eVar4 == 0) {
        buf = sig[1].certs + privkey_len + 0xf8;
        bVar3 = rngIsValid();
        if (bVar3 == 0) {
          sVar6 = 0;
        }
        else {
          rngStepR(buf,privkey_len,(void *)0x0);
          sVar6 = privkey_len;
        }
        if (privkey_len == 0x18) {
          eVar4 = bign96Sign2((octet *)sig,(bign_params *)local_48,poVar8,oid_len,hash,privkey,buf,
                              sVar6);
          sVar6 = 0x22;
        }
        else {
          eVar4 = bignSign2((octet *)sig,(bign_params *)local_48,poVar8,oid_len,hash,privkey,buf,
                            sVar6);
          sVar6 = (privkey_len >> 1) * 3;
        }
        sig->sig_len = sVar6;
        if (eVar4 == 0) {
          bVar3 = cmdFileAreSame(name,sig_name);
          if (bVar3 == 0) {
            eVar4 = cmdSigWrite(sig_name,sig);
          }
          else {
            eVar4 = cmdSigAppend(sig_name,sig);
          }
        }
      }
    }
  }
LAB_001067a3:
  blobClose(sig);
  return eVar4;
}

Assistant:

err_t cmdSigSign(const char* sig_name, const char* name, const char* certs,
	const octet date[6], const octet privkey[], size_t privkey_len)
{
	err_t code;
	void* stack;
	cmd_sig_t* sig;
	bign_params* params;
	octet* oid_der;
	size_t oid_len = 16;
	octet* hash;
	octet* t;
	size_t t_len;
	// входной контроль
	if (!strIsValid(sig_name) || !strIsValid(name) ||
		!(privkey_len == 24 || privkey_len == 32 || privkey_len == 48 || 
			privkey_len == 64) ||
		!memIsValid(date, 6) ||
		!memIsValid(privkey, privkey_len))
		return ERR_BAD_INPUT;
	if (!memIsZero(date, 6) && !tmDateIsValid2(date))
		return ERR_BAD_DATE;
	// выделить и разметить память
	code = cmdBlobCreate(stack,
		sizeof(cmd_sig_t) + sizeof(bign_params) + oid_len + 2 * privkey_len);
	ERR_CALL_CHECK(code);
	sig = (cmd_sig_t*)stack;
	params = (bign_params*)(sig + 1);
	oid_der = (octet*)(params + 1);
	hash = oid_der + 16;
	t = hash + privkey_len;
	// зафиксировать дату
	memCopy(sig->date, date, 6);
	// указаны сертификаты?
	if (certs)
	{
		// собрать сертификаты
		sig->certs_len = sizeof(sig->certs);
		code = cmdCVCsCreate(sig->certs, &sig->certs_len, certs);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// проверить цепочку
		code = cmdCVCsVal(sig->certs, sig->certs_len, sig->date);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	}
	else
		sig->certs_len = 0;
	// проверить соответствие личному ключу
	if (sig->certs_len)
	{
		size_t offset;
		size_t cert_len;
		// найти последний сертификат
		code = cmdCVCsGetLast(&offset, &cert_len, sig->certs, sig->certs_len);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// проверить соответствие личному ключу
		code = btokCVCMatch(sig->certs + offset, cert_len, privkey,
			privkey_len);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	}
	// загрузить долговременные параметры
	code = cmdSigParamsStd(params, privkey_len);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// хэшировать
	code = cmdSigHash(hash, privkey_len, name, 0, sig->certs, sig->certs_len, 
		sig->date);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	if (privkey_len <= 32)
	{
		code = bignOidToDER(oid_der, &oid_len, "1.2.112.0.2.0.34.101.31.81");
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		ASSERT(oid_len == 11);
	}
	else 
	{
		code = bignOidToDER(oid_der, &oid_len, privkey_len == 48 ? 
			"1.2.112.0.2.0.34.101.77.12" : "1.2.112.0.2.0.34.101.77.13");
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		ASSERT(oid_len == 11);
	}
	// получить случайные числа
	if (rngIsValid())
		rngStepR(t, t_len = privkey_len, 0);
	else
		t_len = 0;
	// подписать
	if (privkey_len == 24)
	{
		code = bign96Sign2(sig->sig, params, oid_der, oid_len, hash, privkey, 
			t, t_len);
		sig->sig_len = 34;
	}
	else
	{
		code = bignSign2(sig->sig, params, oid_der, oid_len, hash, privkey, 
			t, t_len);
		sig->sig_len = privkey_len / 2 * 3;
	}
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// сохранить подпись
	if (cmdFileAreSame(name, sig_name))
		code = cmdSigAppend(sig_name, sig);
	else
		code = cmdSigWrite(sig_name, sig);
	// завершить
	cmdBlobClose(stack);
	return code;
}